

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void nighttime(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  searchlight_movement_t *slstate;
  
  if (state->searchlight_state == 0xff) {
    slstate = (state->searchlight).states;
    iVar5 = 3;
    goto LAB_00107928;
  }
  if (state->room_index != '\0') {
    state->searchlight_state = 0xff;
    return;
  }
  bVar1 = (state->map_position).x;
  if (state->searchlight_state == '\x1f') {
    bVar7 = bVar1 + 4;
    bVar4 = (state->map_position).y;
    bVar6 = (state->searchlight).caught_coord.x;
    bVar2 = (state->searchlight).caught_coord.y;
    if (bVar6 == bVar7) {
      if (bVar2 == bVar4) {
        return;
      }
    }
    else if (bVar6 < bVar7) {
      bVar7 = bVar6 + 1;
    }
    else {
      bVar7 = bVar6 - 1;
    }
    bVar6 = bVar4;
    if (bVar2 != bVar4) {
      if (bVar2 < bVar4) {
        bVar6 = bVar2 + 1;
      }
      else {
        bVar6 = bVar2 - 1;
      }
    }
    (state->searchlight).caught_coord.x = bVar7;
    (state->searchlight).caught_coord.y = bVar6;
  }
  else {
    bVar4 = (state->map_position).y;
    bVar7 = (state->searchlight).caught_coord.x;
    bVar6 = (state->searchlight).caught_coord.y;
  }
  slstate = (searchlight_movement_t *)&(state->searchlight).caught_coord;
  uVar3 = (uint)bVar7;
  iVar5 = 1;
  do {
    searchlight_plot(state,(state->speccy->screen).attributes +
                           (int)((uVar3 - bVar1) + ((uint)bVar6 - (uint)bVar4) * state->width + 0x46
                                ),(int)(uVar3 - bVar1) >> 0x1f & 0xff);
    do {
      do {
        slstate = slstate + 1;
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          return;
        }
LAB_00107928:
        searchlight_movement(slstate);
        searchlight_caught(state,slstate);
        bVar1 = (state->map_position).x;
        uVar3 = (uint)(slstate->xy).x;
      } while ((uVar3 + 0x10 < (uint)bVar1) || ((int)(state->columns + (uint)bVar1) <= (int)uVar3));
      bVar4 = (state->map_position).y;
      bVar6 = (slstate->xy).y;
    } while ((bVar6 + 0x10 < (uint)bVar4) || ((int)(state->rows + (uint)bVar4) <= (int)(uint)bVar6))
    ;
  } while( true );
}

Assistant:

void nighttime(tgestate_t *state)
{
  uint8_t                 map_y;     /* was D */
  uint8_t                 map_x;     /* was E */
  uint8_t                 caught_y;  /* was H */
  uint8_t                 caught_x;  /* was L */
  int                     iters;     /* was B */
  attribute_t            *attrs;     /* was BC */
  searchlight_movement_t *slstate;   /* was HL */
  uint8_t                 clip_left; /* was A */
  int16_t                 column;    /* was BC */
  int16_t                 row;       /* was HL */

  assert(state != NULL);

  if (state->searchlight_state != searchlight_STATE_SEARCHING)
  {
    /* Caught. */

    if (state->room_index > room_0_OUTDOORS)
    {
      /* If the hero goes indoors then the searchlight loses track. */
      state->searchlight_state = searchlight_STATE_SEARCHING;
      return;
    }

    /* Otherwise the hero is outdoors. */

    /* If the searchlight previously caught the hero then track him. */

    if (state->searchlight_state == searchlight_STATE_CAUGHT)
    {
      map_x    = state->map_position.x + 4;
      map_y    = state->map_position.y;
      caught_x = state->searchlight.caught_coord.x; // Conv: Reordered
      caught_y = state->searchlight.caught_coord.y;

      if (caught_x == map_x)
      {
        /* If the highlight doesn't need to move then quit. */
        if (caught_y == map_y)
          return;
      }
      else
      {
        /* Move the searchlight left/right to focus on the hero. */
        if (caught_x < map_x)
          caught_x++;
        else
          caught_x--;
      }

      /* Move searchlight up/down to focus on the hero. */
      if (caught_y != map_y)
      {
        if (caught_y < map_y)
          caught_y++;
        else
          caught_y--;
      }

      state->searchlight.caught_coord.x = caught_x; // Conv: Fused store split apart.
      state->searchlight.caught_coord.y = caught_y;
    }

    map_x = state->map_position.x;
    map_y = state->map_position.y;
    /* This casts caught_coord into a searchlight_movement_t knowing that
     * only the coord members will be accessed. */
    slstate = (searchlight_movement_t *) &state->searchlight.caught_coord;
    iters = 1; // 1 iteration
    // PUSH BC
    // PUSH HL
    goto middle_bit;
  }

  /* When not tracking the hero all three searchlights are cycled through. */

  slstate = &state->searchlight.states[0];
  iters = 3; // 3 iterations == three searchlights
  do
  {
    searchlight_movement(slstate);
    searchlight_caught(state, slstate);

    map_x = state->map_position.x; // in E
    map_y = state->map_position.y; // in D

    /* Would the searchlight intersect with the game window? */
    // Conv: Reordered into the expected series
    // first check is if the searchlight image is off the left hand side
    // second check is if the searchlight image is off the right hand side
    // etc.
    if (slstate->xy.x + 16 < map_x || slstate->xy.x >= map_x + state->columns ||
        slstate->xy.y + 16 < map_y || slstate->xy.y >= map_y + state->rows)
      goto next;

middle_bit:
    clip_left = 0; // flag // the light is clipped to the left side of the window

    // HL points to slstate->xy OR -> state->searchlight.caught_coord depending on how it's entered

    column = slstate->xy.x - map_x;
    if (column < 0) // partly off the left hand side of the window
      clip_left = ~clip_left; // toggle flag 0 -> 255

    row = slstate->xy.y - map_y;

    // FUTURE: To avoid undefined behaviour (row & column _can_ be out of
    // bounds) pass the row and column into searchlight_plot.

    attrs = &state->speccy->screen.attributes[0x46 + row * state->width + column]; // 0x46 = address of top-left game window attribute

    // Conv: clip_left turned from state variable into function parameter.
    searchlight_plot(state, attrs, clip_left); // DE turned into HL from EX above

next:
    // POP HL
    // POP BC
    slstate++;
  }
  while (--iters);
}